

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeConcatLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  Type *pTVar1;
  mapped_type *pmVar2;
  mapped_type *this_00;
  ConcatLayerParams *pCVar3;
  ShapeRange *pSVar4;
  int i;
  int index;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_01;
  ShapeRange outShape;
  ShapeRange local_50;
  
  this_01 = &this->blobShapes;
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_01,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_00,pTVar1);
  ShapeRange::ShapeRange(&outShape);
  pCVar3 = Specification::NeuralNetworkLayer::concat(specLayer);
  if (pCVar3->sequenceconcat_ == true) {
    pSVar4 = ShapeConstraint::sequenceRange(pmVar2);
    outShape._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
    outShape._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
    outShape._minimum._val = (pSVar4->_minimum)._val;
    outShape._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
    outShape._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
    outShape._maximum._val = (pSVar4->_maximum)._val;
    pSVar4 = ShapeConstraint::channelRange(pmVar2);
    ShapeConstraint::updateChannelRange(this_00,pSVar4);
  }
  else {
    pSVar4 = ShapeConstraint::channelRange(pmVar2);
    outShape._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
    outShape._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
    outShape._minimum._val = (pSVar4->_minimum)._val;
    outShape._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
    outShape._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
    outShape._maximum._val = (pSVar4->_maximum)._val;
    pSVar4 = ShapeConstraint::sequenceRange(pmVar2);
    ShapeConstraint::updateSequenceRange(this_00,pSVar4);
  }
  pSVar4 = ShapeConstraint::batchRange(pmVar2);
  ShapeConstraint::updateBatchRange(this_00,pSVar4);
  pSVar4 = ShapeConstraint::heightRange(pmVar2);
  ShapeConstraint::updateHeightRange(this_00,pSVar4);
  pSVar4 = ShapeConstraint::widthRange(pmVar2);
  ShapeConstraint::updateWidthRange(this_00,pSVar4);
  for (index = 1; index < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(specLayer->input_).super_RepeatedPtrFieldBase,index);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_01,pTVar1);
    pCVar3 = Specification::NeuralNetworkLayer::concat(specLayer);
    if (pCVar3->sequenceconcat_ == true) {
      pSVar4 = ShapeConstraint::sequenceRange(pmVar2);
      ShapeRange::operator+(&local_50,&outShape,pSVar4);
      outShape._maximum._isUnbound = local_50._maximum._isUnbound;
      outShape._maximum._1_7_ = local_50._maximum._1_7_;
      outShape._maximum._val = local_50._maximum._val;
      outShape._minimum._isUnbound = local_50._minimum._isUnbound;
      outShape._minimum._1_7_ = local_50._minimum._1_7_;
      outShape._minimum._val = local_50._minimum._val;
      pSVar4 = ShapeConstraint::channelRange(pmVar2);
      ShapeConstraint::updateChannelRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange(pmVar2,pSVar4);
    }
    else {
      pSVar4 = ShapeConstraint::channelRange(pmVar2);
      ShapeRange::operator+(&local_50,&outShape,pSVar4);
      outShape._maximum._isUnbound = local_50._maximum._isUnbound;
      outShape._maximum._1_7_ = local_50._maximum._1_7_;
      outShape._maximum._val = local_50._maximum._val;
      outShape._minimum._isUnbound = local_50._minimum._isUnbound;
      outShape._minimum._1_7_ = local_50._minimum._1_7_;
      outShape._minimum._val = local_50._minimum._val;
      pSVar4 = ShapeConstraint::sequenceRange(pmVar2);
      ShapeConstraint::updateSequenceRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::sequenceRange(this_00);
      ShapeConstraint::updateSequenceRange(pmVar2,pSVar4);
    }
    pSVar4 = ShapeConstraint::batchRange(pmVar2);
    ShapeConstraint::updateBatchRange(this_00,pSVar4);
    pSVar4 = ShapeConstraint::batchRange(this_00);
    ShapeConstraint::updateBatchRange(pmVar2,pSVar4);
    pSVar4 = ShapeConstraint::heightRange(pmVar2);
    ShapeConstraint::updateHeightRange(this_00,pSVar4);
    pSVar4 = ShapeConstraint::heightRange(this_00);
    ShapeConstraint::updateHeightRange(pmVar2,pSVar4);
    pSVar4 = ShapeConstraint::widthRange(pmVar2);
    ShapeConstraint::updateWidthRange(this_00,pSVar4);
    pSVar4 = ShapeConstraint::widthRange(this_00);
    ShapeConstraint::updateWidthRange(pmVar2,pSVar4);
  }
  pCVar3 = Specification::NeuralNetworkLayer::concat(specLayer);
  if (pCVar3->sequenceconcat_ == false) {
    ShapeConstraint::updateChannelRange(this_00,&outShape);
  }
  else {
    ShapeConstraint::updateSequenceRange(this_00,&outShape);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeConcatLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Concat layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Concat layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    ShapeRange outShape;
    if (specLayer.concat().sequenceconcat()) {
        outShape = inputShape.sequenceRange();
        outputShape.updateChannelRange(inputShape.channelRange());
    }
    else {
        outShape = inputShape.channelRange();
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    outputShape.updateBatchRange(inputShape.batchRange());
    outputShape.updateHeightRange(inputShape.heightRange());
    outputShape.updateWidthRange(inputShape.widthRange());

    for (int i = 1; i < specLayer.input_size(); i++) {
        ShapeConstraint& inputShapei = blobShapes[specLayer.input(i)];
        if (specLayer.concat().sequenceconcat()) {
            outShape = outShape + inputShapei.sequenceRange();
            outputShape.updateChannelRange(inputShapei.channelRange());
            inputShapei.updateChannelRange(outputShape.channelRange());
        }
        else {
            outShape = outShape + inputShapei.channelRange();
            outputShape.updateSequenceRange(inputShapei.sequenceRange());
            inputShapei.updateSequenceRange(outputShape.sequenceRange());
        }
        outputShape.updateBatchRange(inputShapei.batchRange());
        inputShapei.updateBatchRange(outputShape.batchRange());

        outputShape.updateHeightRange(inputShapei.heightRange());
        inputShapei.updateHeightRange(outputShape.heightRange());

        outputShape.updateWidthRange(inputShapei.widthRange());
        inputShapei.updateWidthRange(outputShape.widthRange());

    }

    if (specLayer.concat().sequenceconcat()) {
        outputShape.updateSequenceRange(outShape);
    }
    else {
        outputShape.updateChannelRange(outShape);
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Concat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Concat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}